

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

int __thiscall
helics::zeromq::ZmqCommsSS::replyToIncomingMessage(ZmqCommsSS *this,message_t *msg,socket_t *sock)

{
  void *data;
  size_t size;
  size_t in_RCX;
  int iVar1;
  int in_R8D;
  string str;
  ActionMessage resp;
  ActionMessage M;
  
  data = zmq::message_t::data(msg);
  size = zmq::message_t::size(msg);
  ActionMessage::ActionMessage(&M,data,size);
  if (((M.messageAction == cmd_protocol_priority) || (M.messageAction == cmd_protocol_big)) ||
     (M.messageAction == cmd_protocol)) {
    if (M.messageID == 0x16570bf) {
      iVar1 = -1;
      goto LAB_002276e9;
    }
    NetworkCommsInterface::generateReplyToIncomingMessage
              (&resp,&this->super_NetworkCommsInterface,&M);
    ActionMessage::to_string_abi_cxx11_((string *)&str,&resp);
    zmq::detail::socket_base::send(&sock->super_socket_base,(int)&str,(void *)0x0,in_RCX,in_R8D);
  }
  else {
    std::function<void_(helics::ActionMessage_&&)>::operator()
              (&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback,&M);
    ActionMessage::ActionMessage(&resp,cmd_priority_ack);
    ActionMessage::to_string_abi_cxx11_((string *)&str,&resp);
    zmq::detail::socket_base::send(&sock->super_socket_base,(int)&str,(void *)0x0,in_RCX,in_R8D);
  }
  iVar1 = 0;
  std::__cxx11::string::~string((string *)&str);
  ActionMessage::~ActionMessage(&resp);
LAB_002276e9:
  ActionMessage::~ActionMessage(&M);
  return iVar1;
}

Assistant:

int ZmqCommsSS::replyToIncomingMessage(zmq::message_t& msg, zmq::socket_t& sock)
{
    ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());
    if (isProtocolCommand(M)) {
        if (M.messageID == CLOSE_RECEIVER) {
            return (-1);
        }
        auto reply = generateReplyToIncomingMessage(M);
        auto str = reply.to_string();
        sock.send(str);
        return 0;
    }
    ActionCallback(std::move(M));
    ActionMessage resp(CMD_PRIORITY_ACK);
    auto str = resp.to_string();
    sock.send(str);
    return 0;
}